

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageLevel.cpp
# Opt level: O2

FlatImageChannel * __thiscall
Imf_2_5::FlatImageLevel::findChannel(FlatImageLevel *this,string *name)

{
  const_iterator cVar1;
  FlatImageChannel *pFVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>_>_>
          ::find(&(this->_channels)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->_channels)._M_t._M_impl.super__Rb_tree_header) {
    pFVar2 = (FlatImageChannel *)0x0;
  }
  else {
    pFVar2 = *(FlatImageChannel **)(cVar1._M_node + 2);
  }
  return pFVar2;
}

Assistant:

const FlatImageChannel *
FlatImageLevel::findChannel (const string& name) const
{
    ChannelMap::const_iterator i = _channels.find (name);

    if (i != _channels.end())
        return i->second;
    else
        return 0;
}